

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * getBlurayStreamDir(string *__return_storage_ptr__,string *mplsName)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  allocator<char> local_182;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140 [32];
  undefined4 local_120;
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0 [32];
  string local_90 [32];
  long local_70;
  size_t tmp;
  string local_58;
  undefined1 local_38 [8];
  string dirName;
  string *mplsName_local;
  
  dirName.field_2._8_8_ = mplsName;
  extractFileDir((string *)local_38,mplsName);
  toNativeSeparators(&local_58,(string *)local_38);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_90,(ulong)local_38);
  cVar1 = getDirSeparator();
  lVar3 = std::__cxx11::string::find_last_of((char)local_90,(ulong)(uint)(int)cVar1);
  std::__cxx11::string::~string(local_90);
  local_70 = lVar3;
  if (lVar3 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_182);
    std::allocator<char>::~allocator(&local_182);
  }
  else {
    std::__cxx11::string::substr((ulong)local_b0,(ulong)local_38);
    std::__cxx11::string::operator=((string *)local_38,local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"BACKUP",&local_f1);
    cVar1 = getDirSeparator();
    std::operator+(&local_d0,&local_f0,cVar1);
    bVar2 = strEndWith((string *)local_38,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    if (bVar2) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_118,(ulong)local_38);
      cVar1 = getDirSeparator();
      local_70 = std::__cxx11::string::find_last_of((char)local_118,(ulong)(uint)(int)cVar1);
      std::__cxx11::string::~string(local_118);
      if (local_70 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_119);
        std::allocator<char>::~allocator(&local_119);
        goto LAB_002bce77;
      }
      std::__cxx11::string::substr((ulong)local_140,(ulong)local_38);
      std::__cxx11::string::operator=((string *)local_38,local_140);
      std::__cxx11::string::~string(local_140);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"STREAM",&local_181);
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   &local_180);
    cVar1 = getDirSeparator();
    std::operator+(__return_storage_ptr__,&local_160,cVar1);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
  }
LAB_002bce77:
  local_120 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string getBlurayStreamDir(const string& mplsName)
{
    string dirName = extractFileDir(mplsName);
    dirName = toNativeSeparators(dirName);
    size_t tmp = dirName.substr(0, dirName.size() - 1).find_last_of(getDirSeparator());
    if (tmp != string::npos)
    {
        dirName = dirName.substr(0, tmp + 1);
        if (strEndWith(dirName, string("BACKUP") + getDirSeparator()))
        {
            tmp = dirName.substr(0, dirName.size() - 1).find_last_of(getDirSeparator());
            if (tmp == string::npos)
                return "";
            dirName = dirName.substr(0, tmp + 1);
        }
        return dirName + string("STREAM") + getDirSeparator();
    }
    return "";
}